

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeDeviceGet(ze_driver_handle_t hDriver,uint32_t *pCount,ze_device_handle_t *phDevices)

{
  object_t<_ze_device_handle_t_*> *poVar1;
  bool bVar2;
  bad_alloc *anon_var_0;
  ulong local_48;
  size_t i;
  ze_pfnDeviceGet_t pfnGet;
  dditable_t *dditable;
  ze_device_handle_t *pp_Stack_28;
  ze_result_t result;
  ze_device_handle_t *phDevices_local;
  uint32_t *pCount_local;
  ze_driver_handle_t hDriver_local;
  
  dditable._4_4_ = 0;
  pfnGet = *(ze_pfnDeviceGet_t *)(hDriver + 8);
  if (*(code **)(pfnGet + 0xe0) == (code *)0x0) {
    hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pCount_local = *(uint32_t **)hDriver;
    pp_Stack_28 = phDevices;
    phDevices_local = (ze_device_handle_t *)pCount;
    dditable._4_4_ = (**(code **)(pfnGet + 0xe0))(pCount_local,pCount,phDevices);
    hDriver_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      local_48 = 0;
      while( true ) {
        bVar2 = false;
        if (pp_Stack_28 != (ze_device_handle_t *)0x0) {
          bVar2 = local_48 < *(uint *)phDevices_local;
        }
        if (!bVar2) break;
        poVar1 = singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>::
                 getInstance<_ze_device_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>
                             *)(context + 0x120),pp_Stack_28 + local_48,(dditable_t **)&pfnGet);
        pp_Stack_28[local_48] = (ze_device_handle_t)poVar1;
        local_48 = local_48 + 1;
      }
      hDriver_local._4_4_ = dditable._4_4_;
    }
  }
  return hDriver_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGet(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of devices available.
                                                        ///< if count is greater than the number of devices available, then the
                                                        ///< driver shall update the value with the correct number of devices available.
        ze_device_handle_t* phDevices                   ///< [in,out][optional][range(0, *pCount)] array of handle of devices.
                                                        ///< if count is less than the number of devices available, then driver
                                                        ///< shall only retrieve that number of devices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnGet = dditable->ze.Device.pfnGet;
        if( nullptr == pfnGet )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnGet( hDriver, pCount, phDevices );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phDevices ) && ( i < *pCount ); ++i )
                phDevices[ i ] = reinterpret_cast<ze_device_handle_t>(
                    context->ze_device_factory.getInstance( phDevices[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }